

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstackedlayout.cpp
# Opt level: O1

QLayoutItem * __thiscall QStackedLayout::takeAt(QStackedLayout *this,int index)

{
  long lVar1;
  int iVar2;
  QLayoutItem *pQVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong i;
  long in_FS_OFFSET;
  int local_4c;
  void *local_48;
  int *piStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < index) {
    lVar1 = *(long *)&(this->super_QLayout).field_0x8;
    i = (ulong)(uint)index;
    if (i < *(ulong *)(lVar1 + 0xc0)) {
      pQVar3 = QList<QLayoutItem_*>::takeAt((QList<QLayoutItem_*> *)(lVar1 + 0xb0),i);
      iVar2 = *(int *)(lVar1 + 200);
      if (iVar2 == index) {
        *(undefined4 *)(lVar1 + 200) = 0xffffffff;
        if (*(ulong *)(lVar1 + 0xc0) == 0) {
          piStack_40 = &local_4c;
          local_4c = -1;
          local_48 = (void *)0x0;
          QMetaObject::activate((QObject *)this,&staticMetaObject,1,&local_48);
        }
        else {
          setCurrentIndex(this,index - (uint)(*(ulong *)(lVar1 + 0xc0) == i));
        }
      }
      else if (index < iVar2) {
        *(int *)(lVar1 + 200) = iVar2 + -1;
      }
      piStack_40 = &local_4c;
      local_48 = (void *)0x0;
      local_4c = index;
      QMetaObject::activate((QObject *)this,&staticMetaObject,0,&local_48);
      iVar2 = (*pQVar3->_vptr_QLayoutItem[0xd])(pQVar3);
      if (CONCAT44(extraout_var,iVar2) != 0) {
        iVar2 = (*pQVar3->_vptr_QLayoutItem[0xd])(pQVar3);
        if ((*(byte *)(*(long *)(CONCAT44(extraout_var_00,iVar2) + 8) + 0x30) & 4) == 0) {
          iVar2 = (*pQVar3->_vptr_QLayoutItem[0xd])(pQVar3);
          QWidget::hide((QWidget *)CONCAT44(extraout_var_01,iVar2));
        }
      }
      goto LAB_002f1ff6;
    }
  }
  pQVar3 = (QLayoutItem *)0x0;
LAB_002f1ff6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return pQVar3;
  }
  __stack_chk_fail();
}

Assistant:

QLayoutItem *QStackedLayout::takeAt(int index)
{
    Q_D(QStackedLayout);
    if (index <0 || index >= d->list.size())
        return nullptr;
    QLayoutItem *item = d->list.takeAt(index);
    if (index == d->index) {
        d->index = -1;
        if ( d->list.size() > 0 ) {
            int newIndex = (index == d->list.size()) ? index-1 : index;
            setCurrentIndex(newIndex);
        } else {
            emit currentChanged(-1);
        }
    } else if (index < d->index) {
        --d->index;
    }
    emit widgetRemoved(index);
    if (item->widget() && !qt_wasDeleted(item->widget()))
        item->widget()->hide();
    return item;
}